

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_tree.cpp
# Opt level: O0

pair<bool,_char> __thiscall HuffTree::walk(HuffTree *this,bool branch)

{
  bool bVar1;
  undefined8 uVar2;
  pointer pTVar3;
  HuffmanException *this_00;
  byte in_SIL;
  long *in_RDI;
  string *in_stack_ffffffffffffff58;
  HuffmanException *in_stack_ffffffffffffff60;
  allocator local_71;
  string local_70 [35];
  undefined1 local_4d;
  allocator local_39;
  string local_38 [39];
  byte local_11;
  pair<bool,_char> local_2;
  
  local_11 = in_SIL & 1;
  if (local_11 == 0) {
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                       0x11b567);
    if (!bVar1) {
      this_00 = (HuffmanException *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_70,"Incorrect Huffman tree! (Check your input file for correctness!)",
                 &local_71);
      HuffmanException::HuffmanException(this_00,in_stack_ffffffffffffff58);
      __cxa_throw(this_00,&HuffmanException::typeinfo,HuffmanException::~HuffmanException);
    }
    pTVar3 = std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::get
                       ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                        in_stack_ffffffffffffff60);
    *in_RDI = (long)pTVar3;
  }
  else {
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                       0x11b477);
    if (!bVar1) {
      local_4d = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_38,"Incorrect Huffman tree! (Check your input file for correctness!)",
                 &local_39);
      HuffmanException::HuffmanException(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      local_4d = 0;
      __cxa_throw(uVar2,&HuffmanException::typeinfo,HuffmanException::~HuffmanException);
    }
    pTVar3 = std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::get
                       ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                        in_stack_ffffffffffffff60);
    *in_RDI = (long)pTVar3;
  }
  std::pair<bool,_char>::pair<bool_&,_char_&,_true>
            (&local_2,(bool *)(*in_RDI + 0x18),(char *)*in_RDI);
  return local_2;
}

Assistant:

std::pair<bool, char> HuffTree::walk(bool branch) {
    if (branch) {
        if (!curr_node->_right) {
            throw HuffmanException("Incorrect Huffman tree! (Check your input file for correctness!)");
        }
        curr_node = curr_node->_right.get();
    } else {
        if (!curr_node->_left) {
            throw HuffmanException("Incorrect Huffman tree! (Check your input file for correctness!)");
        }
        curr_node = curr_node->_left.get();
    }
    return {curr_node->_is_leaf, curr_node->_data};
}